

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

MethodOptions * __thiscall
google::protobuf::MethodDescriptorProto::_internal_mutable_options(MethodDescriptorProto *this)

{
  uint32_t *puVar1;
  Arena *arena;
  MethodOptions *pMVar2;
  MethodOptions *p;
  MethodDescriptorProto *this_local;
  
  puVar1 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  *puVar1 = *puVar1 | 8;
  if (this->options_ == (MethodOptions *)0x0) {
    arena = MessageLite::GetArenaForAllocation((MessageLite *)this);
    pMVar2 = MessageLite::CreateMaybeMessage<google::protobuf::MethodOptions>(arena);
    this->options_ = pMVar2;
  }
  return this->options_;
}

Assistant:

inline ::PROTOBUF_NAMESPACE_ID::MethodOptions* MethodDescriptorProto::_internal_mutable_options() {
  _has_bits_[0] |= 0x00000008u;
  if (options_ == nullptr) {
    auto* p = CreateMaybeMessage<::PROTOBUF_NAMESPACE_ID::MethodOptions>(GetArenaForAllocation());
    options_ = p;
  }
  return options_;
}